

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::removeSecondColumnSingletonInDoubletonRow(HPresolve *this,int j,int i)

{
  reference pvVar1;
  reference pvVar2;
  ostream *poVar3;
  int in_EDX;
  int in_ESI;
  int iVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  double __n;
  double extraout_XMM0_Qa;
  double value;
  double in_stack_00000220;
  int in_stack_0000022c;
  HPresolve *in_stack_00000230;
  size_type in_stack_ffffffffffffffd8;
  double __n_00;
  value_type vVar5;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_RDI,in_stack_ffffffffffffffd8);
  *pvVar1 = 0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,in_stack_ffffffffffffffd8);
  if (*pvVar2 <= 0.0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,in_stack_ffffffffffffffd8);
    if (0.0 < *pvVar2 || *pvVar2 == 0.0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,in_stack_ffffffffffffffd8);
      if ((*pvVar2 < 0.0) ||
         (pvVar2 = std::vector<double,_std::allocator<double>_>::at
                             (in_RDI,in_stack_ffffffffffffffd8), 0.0 < *pvVar2)) {
        iVar4 = (int)in_RDI + 0x90;
        std::vector<double,_std::allocator<double>_>::at(in_RDI,in_stack_ffffffffffffffd8);
        std::abs(iVar4);
        iVar4 = (int)in_RDI + 0x78;
        __n_00 = __n;
        std::vector<double,_std::allocator<double>_>::at(in_RDI,(size_type)__n);
        std::abs(iVar4);
        if (extraout_XMM0_Qa <= __n_00) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,(size_type)__n_00);
          vVar5 = *pvVar2;
        }
        else {
          pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,(size_type)__n_00);
          vVar5 = *pvVar2;
        }
      }
      else {
        vVar5 = 0.0;
      }
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,in_stack_ffffffffffffffd8);
      if ((*pvVar2 == 1e+200) && (!NAN(*pvVar2))) {
        if (0 < *(int *)&in_RDI[0x53].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) {
          poVar3 = std::operator<<((ostream *)&std::cout,"PR: Problem unbounded.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        *(undefined4 *)
         &in_RDI[0x6b].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = 2;
        return;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,in_stack_ffffffffffffffd8);
      vVar5 = *pvVar2;
    }
  }
  else {
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,in_stack_ffffffffffffffd8);
    if ((*pvVar2 == -1e+200) && (!NAN(*pvVar2))) {
      if (0 < *(int *)&in_RDI[0x53].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start) {
        poVar3 = std::operator<<((ostream *)&std::cout,"PR: Problem unbounded.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      *(undefined4 *)
       &in_RDI[0x6b].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = 2;
      return;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,in_stack_ffffffffffffffd8);
    vVar5 = *pvVar2;
  }
  setPrimalValue(in_stack_00000230,in_stack_0000022c,in_stack_00000220);
  addChange((HPresolve *)CONCAT44(in_ESI,in_EDX),(int)((ulong)vVar5 >> 0x20),SUB84(vVar5,0),
            (int)((ulong)in_RDI >> 0x20));
  if (0 < *(int *)&in_RDI[0x53].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    poVar3 = std::operator<<((ostream *)&std::cout,"PR: Second singleton column ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
    poVar3 = std::operator<<(poVar3," in doubleton row ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_EDX);
    std::operator<<(poVar3," removed.\n");
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[0x73].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,8);
  *pvVar1 = *pvVar1 + 1;
  std::__cxx11::list<int,_std::allocator<int>_>::remove
            ((list<int,_std::allocator<int>_> *)
             &in_RDI[0x6c].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish,&stack0xfffffffffffffff4);
  return;
}

Assistant:

void HPresolve::removeSecondColumnSingletonInDoubletonRow(const int j, const int i) {
	// case two singleton columns
	// when we get here bounds on xj are updated so we can choose low/upper one
	// depending on the cost of xj
	flagRow.at(i) = 0;
	double value;
	if (colCost.at(j) > 0) {
		if (colLower.at(j) == -HSOL_CONST_INF) {
			if (iPrint > 0)
				cout << "PR: Problem unbounded." << endl;
			status = Unbounded;
			return;
		}
		value = colLower.at(j);
	} else if (colCost.at(j) < 0) {
		if (colUpper.at(j) == HSOL_CONST_INF) {
			if (iPrint > 0)
				cout << "PR: Problem unbounded." << endl;
			status = Unbounded;
			return;
		}
		value = colUpper.at(j);
	} else { //(colCost.at(j) == 0)
		if (colUpper.at(j) >= 0 && colLower.at(j) <= 0)
			value = 0;
		else if (abs(colUpper.at(j)) < abs(colLower.at(j)))
			value = colUpper.at(j);
		else
			value = colLower.at(j);
	}
	setPrimalValue(j, value);
	addChange(SING_COL_DOUBLETON_INEQ_SECOND_SING_COL, 0, j);
	if (iPrint > 0)
		cout << "PR: Second singleton column " << j << " in doubleton row " << i
				<< " removed.\n";
	countRemovedCols[SING_COL_DOUBLETON_INEQ]++;
	singCol.remove(j);
}